

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O0

CATNNode<wchar_t> * __thiscall
Centaurus::CompositeATN<wchar_t>::get_node(CompositeATN<wchar_t> *this,Identifier *id,int index)

{
  mapped_type *this_00;
  CATNNode<wchar_t> *pCVar1;
  int index_local;
  Identifier *id_local;
  CompositeATN<wchar_t> *this_local;
  
  this_00 = std::
            unordered_map<Centaurus::Identifier,_Centaurus::CATNMachine<wchar_t>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::CATNMachine<wchar_t>_>_>_>
            ::at(&this->m_dict,id);
  pCVar1 = CATNMachine<wchar_t>::operator[](this_00,index);
  return pCVar1;
}

Assistant:

const CATNNode<TCHAR>& get_node(const Identifier& id, int index) const
    {
        return m_dict.at(id)[index];
    }